

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall thread_pool::ThreadPool::~ThreadPool(ThreadPool *this)

{
  bool bVar1;
  size_type sVar2;
  thread *it;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  uint32_t i;
  ThreadPool *this_local;
  
  std::atomic<bool>::operator=(&this->terminate_,true);
  __range2._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
    if (sVar2 <= __range2._4_4_) break;
    Semaphore::Signal(&this->thread_semaphore_);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  it = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&it);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  Semaphore::~Semaphore(&this->queue_semaphore_);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue(&this->queue_);
  Semaphore::~Semaphore(&this->thread_semaphore_);
  std::
  unordered_map<std::thread::id,_unsigned_int,_std::hash<std::thread::id>,_std::equal_to<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_unsigned_int>_>_>
  ::~unordered_map(&this->thread_ids_);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~ThreadPool() {
    terminate_ = true;
    for (std::uint32_t i = 0; i < threads_.size(); ++i) {
      thread_semaphore_.Signal();
    }
    for (auto& it : threads_) {
      it.join();
    }
  }